

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataHolder.hpp
# Opt level: O3

void __thiscall
OpenMD::DataHolder::assign<std::__cxx11::string>
          (DataHolder *this,string *keyword,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val)

{
  long *plVar1;
  pointer pcVar2;
  char cVar3;
  iterator iVar4;
  iterator iVar5;
  ostream *poVar6;
  OpenMDException *pOVar7;
  stringstream ss;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::find(&(this->parameters_)._M_t,keyword);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->parameters_)._M_t._M_impl.super__Rb_tree_header) {
    iVar5 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->deprecatedKeywords_)._M_t,keyword);
    if ((_Rb_tree_header *)iVar5._M_node !=
        &(this->deprecatedKeywords_)._M_t._M_impl.super__Rb_tree_header) {
      snprintf(painCave.errMsg,2000,
               "%s keyword has been deprecated in OpenMD. Please update your .omd file.\n",
               (keyword->_M_dataplus)._M_p);
      painCave.isFatal = 0;
      painCave.severity = 2;
      simError();
      return;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(keyword->_M_dataplus)._M_p,keyword->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6," is not a recognized keyword.\n",0x1e);
    pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    OpenMDException::OpenMDException(pOVar7,&local_200);
    __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  plVar1 = *(long **)(iVar4._M_node + 2);
  pcVar2 = (val->_M_dataplus)._M_p;
  local_1e0 = val;
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d8,pcVar2,pcVar2 + val->_M_string_length);
  cVar3 = (**(code **)(*plVar1 + 0x18))(plVar1,(string *)local_1d8);
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  if (cVar3 != '\0') {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Error in parsing ",0x11);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(keyword->_M_dataplus)._M_p,keyword->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,": expected ",0xb);
  (**(code **)(**(long **)(iVar4._M_node + 2) + 0x48))(&local_200);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," but got ",9);
  poVar6 = std::ostream::_M_insert<void_const*>(poVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  pOVar7 = (OpenMDException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  OpenMDException::OpenMDException(pOVar7,&local_200);
  __cxa_throw(pOVar7,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
}

Assistant:

void assign(const std::string& keyword, T val) {
      ParamMap::iterator i = parameters_.find(keyword);
      if (i != parameters_.end()) {
        bool result = i->second->setData(val);
        if (!result) {
          std::stringstream ss;
          ss << "Error in parsing " << keyword << ": expected "
             << i->second->getParamType() << " but got " << &val << "\n";
          throw OpenMDException(ss.str());
        }
      } else if (deprecatedKeywords_.find(keyword) !=
                 deprecatedKeywords_.end()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "%s keyword has been deprecated in OpenMD. Please update your "
                 ".omd file.\n",
                 keyword.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_WARNING;
        simError();
      } else {
        std::stringstream ss;
        ss << keyword << " is not a recognized keyword.\n";
        throw OpenMDException(ss.str());
      }
    }